

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_types.cpp
# Opt level: O3

void duckdb::DuckDBTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  LogicalType *type;
  PhysicalType type_00;
  TypeCatalogEntry *pTVar1;
  pointer pcVar2;
  SchemaCatalogEntry *pSVar3;
  uint uVar4;
  reference pvVar5;
  string *psVar6;
  idx_t iVar7;
  long lVar8;
  iterator iVar9;
  char *pcVar10;
  Vector *pVVar11;
  _func_int **__n;
  ulong index;
  string_t *__args;
  bool bVar12;
  __hashtable *__h;
  string category;
  vector<duckdb::Value,_true> labels;
  Value oid_val;
  ulong local_258;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_250;
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  string local_228;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_208;
  GlobalTableFunctionState *local_1e8;
  vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true> *local_1e0;
  string local_1d8;
  string local_1b8;
  string local_198;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_178 [8];
  LogicalType local_138;
  string local_120;
  LogicalType local_100;
  LogicalType local_e8;
  LogicalType local_d0;
  LogicalType local_b8;
  Value local_a0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_60 [24];
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_1e8 = (data_p->global_state).ptr;
  __n = local_1e8[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            ((long)local_1e8[2]._vptr_GlobalTableFunctionState -
             (long)local_1e8[1]._vptr_GlobalTableFunctionState >> 3)) {
    local_1e0 = (vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true> *)(local_1e8 + 1);
    local_250 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_1e8 + 5);
    index = 0;
    do {
      local_1e8[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar5 = vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true>::operator[]
                         (local_1e0,(size_type)__n);
      pTVar1 = pvVar5->_M_data;
      psVar6 = Catalog::GetName_abi_cxx11_
                         ((pTVar1->super_StandardEntry).super_InCatalogEntry.catalog);
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar2,pcVar2 + psVar6->_M_string_length);
      Value::Value(&local_a0,&local_1b8);
      DataChunk::SetValue(output,0,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      iVar7 = Catalog::GetOid((pTVar1->super_StandardEntry).super_InCatalogEntry.catalog);
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar7);
      Value::BIGINT(&local_a0,lVar8);
      DataChunk::SetValue(output,1,index,&local_a0);
      Value::~Value(&local_a0);
      pSVar3 = (pTVar1->super_StandardEntry).schema;
      pcVar2 = (pSVar3->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar2,
                 pcVar2 + (pSVar3->super_InCatalogEntry).super_CatalogEntry.name._M_string_length);
      Value::Value(&local_a0,&local_198);
      DataChunk::SetValue(output,2,index,&local_a0);
      Value::~Value(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((((pTVar1->super_StandardEntry).schema)->super_InCatalogEntry).
                         super_CatalogEntry.oid);
      Value::BIGINT(&local_a0,lVar8);
      DataChunk::SetValue(output,3,index,&local_a0);
      type = &pTVar1->user_type;
      Value::~Value(&local_a0);
      if ((pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal == true) {
        local_258 = (ulong)type->id_;
      }
      else {
        local_258 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                              ((pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
                               .oid);
      }
      LogicalType::LogicalType(&local_b8,SQLNULL);
      Value::Value(&local_a0,&local_b8);
      LogicalType::~LogicalType(&local_b8);
      iVar9 = ::std::
              _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(local_250,(key_type_conflict2 *)&local_258);
      if (iVar9.super__Node_iterator_base<long,_false>._M_cur == (__node_type *)0x0) {
        local_178[0] = local_250;
        ::std::
        _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                  ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_250,&local_258,(Value *)local_178);
        Value::BIGINT((Value *)local_178,local_258);
        Value::operator=(&local_a0,(Value *)local_178);
        Value::~Value((Value *)local_178);
      }
      else {
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value((Value *)local_178,&local_48);
        Value::operator=(&local_a0,(Value *)local_178);
        Value::~Value((Value *)local_178);
        LogicalType::~LogicalType(&local_48);
      }
      DataChunk::SetValue(output,4,index,&local_a0);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar2 = (pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar2,
                 pcVar2 + (pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                          ._M_string_length);
      Value::Value((Value *)local_178,&local_1d8);
      DataChunk::SetValue(output,5,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      type_00 = (pTVar1->user_type).physical_type_;
      if (type_00 == INVALID) {
        LogicalType::LogicalType(&local_d0,SQLNULL);
        Value::Value((Value *)local_178,&local_d0);
      }
      else {
        iVar7 = GetTypeIdSize(type_00);
        lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar7);
        Value::BIGINT((Value *)local_178,lVar8);
      }
      DataChunk::SetValue(output,6,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      if (type_00 == INVALID) {
        LogicalType::~LogicalType(&local_d0);
      }
      pcVar10 = EnumUtil::ToChars<duckdb::LogicalTypeId>(type->id_);
      ::std::__cxx11::string::string((string *)&local_120,pcVar10,(allocator *)&local_248);
      Value::Value((Value *)local_178,&local_120);
      DataChunk::SetValue(output,7,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      local_248 = local_238;
      local_240 = 0;
      local_238[0] = 0;
      switch(type->id_) {
      case BOOLEAN:
        pcVar10 = "BOOLEAN";
        break;
      case TINYINT:
      case SMALLINT:
      case INTEGER:
      case BIGINT:
      case DECIMAL:
      case FLOAT:
      case DOUBLE:
      case UTINYINT:
      case USMALLINT:
      case UINTEGER:
      case UBIGINT:
      case UHUGEINT:
      case HUGEINT:
        pcVar10 = "NUMERIC";
        break;
      case DATE:
      case TIME:
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
      case INTERVAL:
      case TIMESTAMP_TZ:
      case TIME_TZ:
        pcVar10 = "DATETIME";
        break;
      case CHAR:
      case VARCHAR:
        pcVar10 = "STRING";
        break;
      case BLOB:
      case TIMESTAMP_TZ|SQLNULL:
      case TIME_TZ|SQLNULL:
      case BIT:
      case STRING_LITERAL:
      case INTEGER_LITERAL:
      case VARINT:
      case 0x28:
      case 0x29:
      case TIMESTAMP_TZ|BOOLEAN:
      case TIMESTAMP_TZ|TINYINT:
      case TIMESTAMP_TZ|SMALLINT:
      case TIMESTAMP_TZ|INTEGER:
      case TIMESTAMP_TZ|BIGINT:
      case TIMESTAMP_TZ|DATE:
      case TIMESTAMP_TZ|TIME:
        goto switchD_00a2d922_caseD_1a;
      default:
        uVar4 = type->id_ - 100;
        if ((uVar4 < 8) && ((0x87U >> (uVar4 & 0x1f) & 1) != 0)) {
          pcVar10 = "COMPOSITE";
          break;
        }
        goto switchD_00a2d922_caseD_1a;
      }
      ::std::__cxx11::string::_M_replace((ulong)&local_248,0,(char *)0x0,(ulong)pcVar10);
      if (local_240 == 0) {
switchD_00a2d922_caseD_1a:
        LogicalType::LogicalType(&local_e8,SQLNULL);
        bVar12 = true;
        Value::Value((Value *)local_178,&local_e8);
      }
      else {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,local_248,local_248 + local_240);
        Value::Value((Value *)local_178,&local_228);
        bVar12 = false;
      }
      DataChunk::SetValue(output,8,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      if (bVar12) {
        LogicalType::~LogicalType(&local_e8);
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      Value::Value((Value *)local_178,
                   &(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment);
      DataChunk::SetValue(output,9,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      Value::MAP((Value *)local_178,
                 &(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
      DataChunk::SetValue(output,10,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      Value::BOOLEAN((Value *)local_178,
                     (pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal)
      ;
      DataChunk::SetValue(output,0xb,index,(Value *)local_178);
      Value::~Value((Value *)local_178);
      if ((type->id_ == ENUM) &&
         ((pTVar1->user_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        pVVar11 = EnumType::GetValuesInsertOrder(type);
        __args = (string_t *)pVVar11->data;
        iVar7 = EnumType::GetSize(type);
        local_208.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (; iVar7 != 0; iVar7 = iVar7 - 1) {
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<duckdb::string_t_const&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_208,__args);
          __args = __args + 1;
        }
        LogicalType::LogicalType(&local_138,VARCHAR);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(local_60,&local_208);
        Value::LIST((Value *)local_178,&local_138,(vector<duckdb::Value,_true> *)local_60);
        DataChunk::SetValue(output,0xc,index,(Value *)local_178);
        Value::~Value((Value *)local_178);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_60);
        LogicalType::~LogicalType(&local_138);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_208);
      }
      else {
        LogicalType::LogicalType(&local_100,SQLNULL);
        Value::Value((Value *)local_178,&local_100);
        DataChunk::SetValue(output,0xc,index,(Value *)local_178);
        Value::~Value((Value *)local_178);
        LogicalType::~LogicalType(&local_100);
      }
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      iVar7 = index + 1;
      Value::~Value(&local_a0);
      __n = local_1e8[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    ((long)local_1e8[2]._vptr_GlobalTableFunctionState -
                     (long)local_1e8[1]._vptr_GlobalTableFunctionState >> 3)) &&
            (bVar12 = index < 0x7ff, index = iVar7, bVar12));
    output->count = iVar7;
  }
  return;
}

Assistant:

void DuckDBTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &type_entry = data.entries[data.offset++].get();
		auto &type = type_entry.user_type;

		// return values:
		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, type_entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.catalog.GetOid())));
		// schema_name, LogicalType::VARCHAR
		output.SetValue(col++, count, Value(type_entry.schema.name));
		// schema_oid, LogicalType::BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.schema.oid)));
		// type_oid, BIGINT
		int64_t oid;
		if (type_entry.internal) {
			oid = NumericCast<int64_t>(type.id());
		} else {
			oid = NumericCast<int64_t>(type_entry.oid);
		}
		Value oid_val;
		if (data.oids.find(oid) == data.oids.end()) {
			data.oids.insert(oid);
			oid_val = Value::BIGINT(oid);
		} else {
			oid_val = Value();
		}
		output.SetValue(col++, count, oid_val);
		// type_name, VARCHAR
		output.SetValue(col++, count, Value(type_entry.name));
		// type_size, BIGINT
		auto internal_type = type.InternalType();
		output.SetValue(col++, count,
		                internal_type == PhysicalType::INVALID
		                    ? Value()
		                    : Value::BIGINT(NumericCast<int64_t>(GetTypeIdSize(internal_type))));
		// logical_type, VARCHAR
		output.SetValue(col++, count, Value(EnumUtil::ToString(type.id())));
		// type_category, VARCHAR
		string category;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::DECIMAL:
		case LogicalTypeId::FLOAT:
		case LogicalTypeId::DOUBLE:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
		case LogicalTypeId::HUGEINT:
		case LogicalTypeId::UHUGEINT:
			category = "NUMERIC";
			break;
		case LogicalTypeId::DATE:
		case LogicalTypeId::TIME:
		case LogicalTypeId::TIMESTAMP_SEC:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::INTERVAL:
		case LogicalTypeId::TIME_TZ:
		case LogicalTypeId::TIMESTAMP_TZ:
			category = "DATETIME";
			break;
		case LogicalTypeId::CHAR:
		case LogicalTypeId::VARCHAR:
			category = "STRING";
			break;
		case LogicalTypeId::BOOLEAN:
			category = "BOOLEAN";
			break;
		case LogicalTypeId::STRUCT:
		case LogicalTypeId::LIST:
		case LogicalTypeId::MAP:
		case LogicalTypeId::UNION:
			category = "COMPOSITE";
			break;
		default:
			break;
		}
		output.SetValue(col++, count, category.empty() ? Value() : Value(category));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(type_entry.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(type_entry.tags));
		// internal, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(type_entry.internal));
		// labels, VARCHAR[]
		if (type.id() == LogicalTypeId::ENUM && type.AuxInfo()) {
			auto data = FlatVector::GetData<string_t>(EnumType::GetValuesInsertOrder(type));
			idx_t size = EnumType::GetSize(type);

			vector<Value> labels;
			for (idx_t i = 0; i < size; i++) {
				labels.emplace_back(data[i]);
			}

			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, labels));
		} else {
			output.SetValue(col++, count, Value());
		}

		count++;
	}
	output.SetCardinality(count);
}